

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

string * __thiscall
t_html_generator::escape_html_tags
          (string *__return_storage_ptr__,t_html_generator *this,string *str)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  ostream *poVar5;
  undefined8 uVar6;
  string local_3f0 [32];
  _Self local_3d0;
  _Self local_3c8;
  reference local_3c0;
  char *i;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  size_t first_white;
  string tag_key;
  string tag_content;
  ostringstream tagstream;
  ulong local_1b0;
  size_t firstpos;
  size_t lastpos;
  undefined1 local_198 [7];
  uchar c;
  ostringstream result;
  string *str_local;
  t_html_generator *this_local;
  
  result._368_8_ = str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  lastpos._7_1_ = '?';
  local_1b0 = 0;
  while (uVar3 = std::__cxx11::string::length(), local_1b0 < uVar3) {
    for (firstpos = local_1b0; uVar3 = std::__cxx11::string::length(), firstpos < uVar3;
        firstpos = firstpos + 1) {
      puVar4 = (uchar *)std::__cxx11::string::at(result._368_8_);
      lastpos._7_1_ = *puVar4;
      if ((lastpos._7_1_ == '<') || (lastpos._7_1_ == '>')) break;
    }
    if (local_1b0 < firstpos) {
      std::__cxx11::string::substr((ulong)&tagstream.field_0x170,result._368_8_);
      std::operator<<((ostream *)local_198,(string *)&tagstream.field_0x170);
      std::__cxx11::string::~string((string *)&tagstream.field_0x170);
      local_1b0 = firstpos;
    }
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_1b0) break;
    local_1b0 = local_1b0 + 1;
    if (lastpos._7_1_ == '>') {
      std::operator<<((ostream *)local_198,"&gt;");
    }
    else {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(tag_content.field_2._M_local_buf + 8));
      while (uVar3 = std::__cxx11::string::length(), local_1b0 < uVar3) {
        puVar4 = (uchar *)std::__cxx11::string::at(result._368_8_);
        lastpos._7_1_ = *puVar4;
        local_1b0 = local_1b0 + 1;
        if (lastpos._7_1_ == '<') {
          std::operator<<((ostream *)((long)&tag_content.field_2 + 8),"&lt;");
        }
        else {
          if (lastpos._7_1_ == '>') break;
          std::operator<<((ostream *)((long)&tag_content.field_2 + 8),lastpos._7_1_);
        }
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::string
                ((string *)&first_white,(string *)(tag_key.field_2._M_local_buf + 8));
      uVar3 = std::__cxx11::string::find_first_of((char *)&first_white,0x4cd39e);
      if (uVar3 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)&first_white,uVar3);
      }
      __end2._M_current = (char *)std::__cxx11::string::begin();
      i = (char *)std::__cxx11::string::end();
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&i), bVar1) {
        local_3c0 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
        iVar2 = tolower((int)*local_3c0);
        *local_3c0 = (char)iVar2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      local_3c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->allowed_markup,(key_type *)&first_white);
      local_3d0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->allowed_markup);
      bVar1 = std::operator!=(&local_3c8,&local_3d0);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)local_198,"<");
        poVar5 = std::operator<<(poVar5,(string *)(tag_key.field_2._M_local_buf + 8));
        std::operator<<(poVar5,">");
      }
      else {
        poVar5 = std::operator<<((ostream *)local_198,"&lt;");
        std::__cxx11::ostringstream::str();
        poVar5 = std::operator<<(poVar5,local_3f0);
        std::operator<<(poVar5,"&gt;");
        std::__cxx11::string::~string(local_3f0);
        uVar6 = std::__cxx11::string::c_str();
        pverbose("illegal markup <%s> in doc-comment\n",uVar6);
      }
      std::__cxx11::string::~string((string *)&first_white);
      std::__cxx11::string::~string((string *)(tag_key.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(tag_content.field_2._M_local_buf + 8));
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string t_html_generator::escape_html_tags(std::string const& str) {
  std::ostringstream result;

  unsigned char c = '?';
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      if (('<' == c) || ('>' == c)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // tag end without corresponding begin
    ++firstpos;
    if ('>' == c) {
      result << "&gt;";
      continue;
    }

    // extract the tag
    std::ostringstream tagstream;
    while (firstpos < str.length()) {
      c = str.at(firstpos);
      ++firstpos;
      if ('<' == c) {
        tagstream << "&lt;"; // nested begin?
      } else if ('>' == c) {
        break;
      } else {
        tagstream << c; // not very efficient, but tags should be quite short
      }
    }

    // we allow for several markup in docstrings, all else will become escaped
    string tag_content = tagstream.str();
    string tag_key = tag_content;
    size_t first_white = tag_key.find_first_of(" \t\f\v\n\r");
    if (first_white != string::npos) {
      tag_key.erase(first_white);
    }
    for (char & i : tag_key) {
      i = tolower(i);
    }
    if (allowed_markup.find(tag_key) != allowed_markup.end()) {
      result << "<" << tag_content << ">";
    } else {
      result << "&lt;" << tagstream.str() << "&gt;";
      pverbose("illegal markup <%s> in doc-comment\n", tag_key.c_str());
    }
  }

  return result.str();
}